

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O0

void multikey_simd<unsigned_int>(uchar **strings,size_t N,size_t depth)

{
  value_type vVar1;
  value_type vVar2;
  uchar *puVar3;
  size_t sVar4;
  bool bVar5;
  uint pivot;
  int iVar6;
  uint32_t c;
  uint uVar7;
  reference pvVar8;
  uchar **__first;
  ulong local_b0;
  size_t i_1;
  size_t bucketindex [3];
  uchar **sorted;
  size_t i;
  undefined1 local_70 [8];
  array<unsigned_long,_3UL> bucketsize;
  uint8_t *oracle;
  uint partval;
  size_t depth_local;
  size_t N_local;
  uchar **strings_local;
  undefined8 local_28;
  size_t local_20;
  uchar **local_18;
  unsigned_long local_10;
  
  if (N < 0x20) {
    insertion_sort(strings,(int)N,depth);
  }
  else {
    pivot = pseudo_median<unsigned_int>(strings,N,depth);
    local_28 = 0x10;
    local_20 = N;
    iVar6 = posix_memalign(&strings_local,0x10,N);
    if (iVar6 == 0) {
      local_18 = strings_local;
    }
    else {
      local_18 = (uchar **)0x0;
    }
    bucketsize._M_elems[2] = (unsigned_long)local_18;
    i = 0;
    std::array<unsigned_long,_3UL>::fill((array<unsigned_long,_3UL> *)local_70,&i);
    sorted = (uchar **)(N - (N & 0xf));
    calculate_bucketsizes_sse<false>
              (strings,(size_t)sorted,(uint8_t *)bucketsize._M_elems[2],pivot,depth);
    for (; sorted < N; sorted = (uchar **)((long)sorted + 1)) {
      c = get_char<unsigned_int>(strings[(long)sorted],depth);
      uVar7 = get_bucket<unsigned_int>(c,pivot);
      *(char *)(bucketsize._M_elems[2] + (long)sorted) = (char)uVar7;
    }
    for (sorted = (uchar **)0x0; sorted < N; sorted = (uchar **)((long)sorted + 1)) {
      pvVar8 = std::array<unsigned_long,_3UL>::operator[]
                         ((array<unsigned_long,_3UL> *)local_70,
                          (ulong)*(byte *)(bucketsize._M_elems[2] + (long)sorted));
      *pvVar8 = *pvVar8 + 1;
    }
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
    vVar1 = *pvVar8;
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,1);
    vVar2 = *pvVar8;
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,2);
    if (vVar1 + vVar2 + *pvVar8 != N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x127,
                    "void multikey_simd(unsigned char **, size_t, size_t) [CharT = unsigned int]");
    }
    __first = (uchar **)malloc(N << 3);
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
    bucketindex[0] = *pvVar8;
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
    vVar1 = *pvVar8;
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,1);
    bucketindex[1] = vVar1 + *pvVar8;
    for (local_b0 = 0; local_b0 < N; local_b0 = local_b0 + 1) {
      puVar3 = strings[local_b0];
      sVar4 = bucketindex[(ulong)*(byte *)(bucketsize._M_elems[2] + local_b0) - 1];
      bucketindex[(ulong)*(byte *)(bucketsize._M_elems[2] + local_b0) - 1] = sVar4 + 1;
      __first[sVar4] = puVar3;
    }
    std::copy<unsigned_char**,unsigned_char**>(__first,__first + N,strings);
    free(__first);
    local_10 = bucketsize._M_elems[2];
    free((void *)bucketsize._M_elems[2]);
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
    multikey_simd<unsigned_int>(strings,*pvVar8,depth);
    bVar5 = is_end<unsigned_int>(pivot);
    if (!bVar5) {
      pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
      vVar1 = *pvVar8;
      pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,1);
      multikey_simd<unsigned_int>(strings + vVar1,*pvVar8,depth + 4);
    }
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,0);
    vVar1 = *pvVar8;
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,1);
    vVar2 = *pvVar8;
    pvVar8 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_70,2);
    multikey_simd<unsigned_int>(strings + vVar1 + vVar2,*pvVar8,depth);
  }
  return;
}

Assistant:

static void
multikey_simd(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(N, 16));
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<false>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i)
		++bucketsize[oracle[i]];
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(N*sizeof(unsigned char*)));
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	free(sorted);
	_mm_free(oracle);
	multikey_simd<CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_simd<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT));
	multikey_simd<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}